

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

char * canonify(char *name)

{
  _Bool _Var1;
  int iVar2;
  sftp_request *req_00;
  sftp_packet *psVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *returnname;
  char *pcStack_40;
  int i;
  char *slash;
  sftp_request *req;
  sftp_packet *pktin;
  char *canonname;
  char *fullname;
  char *name_local;
  
  pcVar5 = pwd;
  if (*name == '/') {
    canonname = dupstr(name);
  }
  else {
    sVar4 = strlen(pwd);
    if (pcVar5[sVar4 - 1] == '/') {
      pcStack_40 = anon_var_dwarf_2471b + 10;
    }
    else {
      pcStack_40 = "/";
    }
    canonname = dupcat_fn(pwd,pcStack_40,name,0);
  }
  req_00 = fxp_realpath_send(canonname);
  psVar3 = sftp_wait_for_reply(req_00);
  name_local = fxp_realpath_recv(psVar3,req_00);
  if (name_local == (char *)0x0) {
    sVar4 = strlen(canonname);
    returnname._4_4_ = (int)sVar4;
    if ((2 < returnname._4_4_) && (canonname[returnname._4_4_ + -1] == '/')) {
      returnname._4_4_ = returnname._4_4_ + -1;
      canonname[returnname._4_4_] = '\0';
    }
    do {
      bVar7 = false;
      if (0 < returnname._4_4_) {
        returnname._4_4_ = returnname._4_4_ + -1;
        bVar7 = canonname[returnname._4_4_] != '/';
      }
    } while (bVar7);
    if ((((canonname[returnname._4_4_] == '/') &&
         (iVar2 = strcmp(canonname + returnname._4_4_,"/."), iVar2 != 0)) &&
        (iVar2 = strcmp(canonname + returnname._4_4_,"/.."), iVar2 != 0)) &&
       (iVar2 = strcmp(canonname,"/"), iVar2 != 0)) {
      canonname[returnname._4_4_] = '\0';
      if (returnname._4_4_ == 0) {
        slash = (char *)fxp_realpath_send("/");
      }
      else {
        slash = (char *)fxp_realpath_send(canonname);
      }
      psVar3 = sftp_wait_for_reply((sftp_request *)slash);
      pcVar5 = fxp_realpath_recv(psVar3,(sftp_request *)slash);
      if (pcVar5 == (char *)0x0) {
        canonname[returnname._4_4_] = '/';
        name_local = canonname;
      }
      else {
        _Var1 = strendswith(pcVar5,"/");
        pcVar6 = "/";
        if (_Var1) {
          pcVar6 = anon_var_dwarf_2471b + 10;
        }
        name_local = dupcat_fn(pcVar5,pcVar6,canonname + (long)returnname._4_4_ + 1,0);
        safefree(canonname);
        safefree(pcVar5);
      }
    }
    else {
      name_local = canonname;
    }
  }
  else {
    safefree(canonname);
  }
  return name_local;
}

Assistant:

char *canonify(const char *name)
{
    char *fullname, *canonname;
    struct sftp_packet *pktin;
    struct sftp_request *req;

    if (name[0] == '/') {
        fullname = dupstr(name);
    } else {
        const char *slash;
        if (pwd[strlen(pwd) - 1] == '/')
            slash = "";
        else
            slash = "/";
        fullname = dupcat(pwd, slash, name);
    }

    req = fxp_realpath_send(fullname);
    pktin = sftp_wait_for_reply(req);
    canonname = fxp_realpath_recv(pktin, req);

    if (canonname) {
        sfree(fullname);
        return canonname;
    } else {
        /*
         * Attempt number 2. Some FXP_REALPATH implementations
         * (glibc-based ones, in particular) require the _whole_
         * path to point to something that exists, whereas others
         * (BSD-based) only require all but the last component to
         * exist. So if the first call failed, we should strip off
         * everything from the last slash onwards and try again,
         * then put the final component back on.
         *
         * Special cases:
         *
         *  - if the last component is "/." or "/..", then we don't
         *    bother trying this because there's no way it can work.
         *
         *  - if the thing actually ends with a "/", we remove it
         *    before we start. Except if the string is "/" itself
         *    (although I can't see why we'd have got here if so,
         *    because surely "/" would have worked the first
         *    time?), in which case we don't bother.
         *
         *  - if there's no slash in the string at all, give up in
         *    confusion (we expect at least one because of the way
         *    we constructed the string).
         */

        int i;
        char *returnname;

        i = strlen(fullname);
        if (i > 2 && fullname[i - 1] == '/')
            fullname[--i] = '\0';      /* strip trailing / unless at pos 0 */
        while (i > 0 && fullname[--i] != '/');

        /*
         * Give up on special cases.
         */
        if (fullname[i] != '/' ||      /* no slash at all */
            !strcmp(fullname + i, "/.") ||      /* ends in /. */
            !strcmp(fullname + i, "/..") ||     /* ends in /.. */
            !strcmp(fullname, "/")) {
            return fullname;
        }

        /*
         * Now i points at the slash. Deal with the final special
         * case i==0 (ie the whole path was "/nonexistentfile").
         */
        fullname[i] = '\0';            /* separate the string */
        if (i == 0) {
            req = fxp_realpath_send("/");
        } else {
            req = fxp_realpath_send(fullname);
        }
        pktin = sftp_wait_for_reply(req);
        canonname = fxp_realpath_recv(pktin, req);

        if (!canonname) {
            /* Even that failed. Restore our best guess at the
             * constructed filename and give up */
            fullname[i] = '/';  /* restore slash and last component */
            return fullname;
        }

        /*
         * We have a canonical name for all but the last path
         * component. Concatenate the last component and return.
         */
        returnname = dupcat(canonname,
                            (strendswith(canonname, "/") ? "" : "/"),
                            fullname + i + 1);
        sfree(fullname);
        sfree(canonname);
        return returnname;
    }
}